

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_sqr.c
# Opt level: O0

int BN_sqr(BIGNUM *r,BIGNUM *a,BN_CTX *ctx)

{
  int iVar1;
  int iVar2;
  BIGNUM *pBVar3;
  BIGNUM *pBVar4;
  BIGNUM *pBVar5;
  int k;
  int j;
  unsigned_long t [32];
  BIGNUM *rr;
  BIGNUM *tmp;
  int ret;
  int al;
  int max;
  BIGNUM *pBVar6;
  int words;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  unsigned_long *in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffed4;
  unsigned_long *in_stack_fffffffffffffed8;
  unsigned_long *in_stack_fffffffffffffee0;
  int local_2c;
  
  local_2c = 0;
  iVar1 = a->top;
  if (iVar1 < 1) {
    r->top = 0;
    r->neg = 0;
    return 1;
  }
  BN_CTX_start(ctx);
  pBVar5 = r;
  if (a == r) {
    pBVar5 = BN_CTX_get(ctx);
  }
  pBVar6 = pBVar5;
  pBVar3 = BN_CTX_get(ctx);
  words = (int)((ulong)pBVar6 >> 0x20);
  if ((pBVar5 != (BIGNUM *)0x0) && (pBVar3 != (BIGNUM *)0x0)) {
    pBVar4 = bn_wexpand((BIGNUM *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                        words);
    if (pBVar4 != (BIGNUM *)0x0) {
      if (iVar1 == 4) {
        bn_sqr_comba4(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      }
      else if (iVar1 == 8) {
        bn_sqr_comba8((unsigned_long *)t[0xe],(unsigned_long *)t[0xd]);
      }
      else if (iVar1 < 0x10) {
        bn_sqr_normal(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,
                      in_stack_fffffffffffffec8);
      }
      else {
        iVar2 = BN_num_bits_word((long)iVar1);
        iVar2 = 1 << ((char)iVar2 - 1U & 0x1f);
        if (iVar1 == iVar2) {
          pBVar4 = bn_wexpand((BIGNUM *)CONCAT44(iVar2,iVar2 * 2),words);
          if (pBVar4 == (BIGNUM *)0x0) goto LAB_0011bd0b;
          bn_sqr_recursive(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                           in_stack_fffffffffffffed4,in_stack_fffffffffffffec8);
        }
        else {
          pBVar4 = bn_wexpand((BIGNUM *)CONCAT44(iVar2,iVar2 * 2),words);
          if (pBVar4 == (BIGNUM *)0x0) goto LAB_0011bd0b;
          bn_sqr_normal(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                        in_stack_fffffffffffffed4,in_stack_fffffffffffffec8);
        }
      }
      pBVar5->neg = 0;
      if (a->d[iVar1 + -1] == (a->d[iVar1 + -1] & 0xffffffff)) {
        pBVar5->top = iVar1 * 2 + -1;
      }
      else {
        pBVar5->top = iVar1 * 2;
      }
      if ((r == pBVar5) || (pBVar5 = BN_copy(r,pBVar5), pBVar5 != (BIGNUM *)0x0)) {
        local_2c = 1;
      }
    }
  }
LAB_0011bd0b:
  BN_CTX_end(ctx);
  return local_2c;
}

Assistant:

int BN_sqr(BIGNUM *r, const BIGNUM *a, BN_CTX *ctx)
{
    int max, al;
    int ret = GML_ERROR;
    BIGNUM *tmp, *rr;

    bn_check_top(a);

    al = a->top;
    if (al <= 0) {
        r->top = 0;
        r->neg = 0;
        return 1;
    }

    BN_CTX_start(ctx);
    rr = (a != r) ? r : BN_CTX_get(ctx);
    tmp = BN_CTX_get(ctx);
    if (!rr || !tmp)
        goto err;

    max = 2 * al;               /* Non-zero (from above) */
    if (bn_wexpand(rr, max) == NULL)
        goto err;

    if (al == 4) {
#ifndef BN_SQR_COMBA
        BN_ULONG t[8];
        bn_sqr_normal(rr->d, a->d, 4, t);
#else
        bn_sqr_comba4(rr->d, a->d);
#endif
    } else if (al == 8) {
#ifndef BN_SQR_COMBA
        BN_ULONG t[16];
        bn_sqr_normal(rr->d, a->d, 8, t);
#else
        bn_sqr_comba8(rr->d, a->d);
#endif
    } else {
#if defined(BN_RECURSION)
        if (al < BN_SQR_RECURSIVE_SIZE_NORMAL) {
            BN_ULONG t[BN_SQR_RECURSIVE_SIZE_NORMAL * 2];
            bn_sqr_normal(rr->d, a->d, al, t);
        } else {
            int j, k;

            j = BN_num_bits_word((BN_ULONG)al);
            j = 1 << (j - 1);
            k = j + j;
            if (al == j) {
                if (bn_wexpand(tmp, k * 2) == NULL)
                    goto err;
                bn_sqr_recursive(rr->d, a->d, al, tmp->d);
            } else {
                if (bn_wexpand(tmp, max) == NULL)
                    goto err;
                bn_sqr_normal(rr->d, a->d, al, tmp->d);
            }
        }
#else
        if (bn_wexpand(tmp, max) == NULL)
            goto err;
        bn_sqr_normal(rr->d, a->d, al, tmp->d);
#endif
    }

    rr->neg = 0;
    /*
     * If the most-significant half of the top word of 'a' is zero, then the
     * square of 'a' will max-1 words.
     */
    if (a->d[al - 1] == (a->d[al - 1] & BN_MASK2l))
        rr->top = max - 1;
    else
        rr->top = max;
    if (r != rr && BN_copy(r, rr) == NULL)
        goto err;

    ret = 1;
 err:
    bn_check_top(rr);
    bn_check_top(tmp);
    BN_CTX_end(ctx);
    return (ret);
}